

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O2

bool __thiscall
ON_Leader::LandingLine3d(ON_Leader *this,ON_DimStyle *dimstyle,double dimscale,ON_Line *line)

{
  bool bVar1;
  ON_Plane *this_00;
  ON_Line line2d;
  ON_3dPoint local_70;
  ON_Line local_58;
  
  ON_Line::ON_Line(&local_58);
  bVar1 = LandingLine2d(this,dimstyle,dimscale,&local_58);
  if (bVar1) {
    this_00 = &(this->super_ON_Annotation).m_plane;
    ON_Plane::PointAt(&local_70,this_00,local_58.from.x,local_58.from.y);
    (line->from).z = local_70.z;
    (line->from).x = local_70.x;
    (line->from).y = local_70.y;
    ON_Plane::PointAt(&local_70,this_00,local_58.to.x,local_58.to.y);
    (line->to).z = local_70.z;
    (line->to).x = local_70.x;
    (line->to).y = local_70.y;
  }
  ON_Line::~ON_Line(&local_58);
  return bVar1;
}

Assistant:

bool ON_Leader::LandingLine3d(
  const ON_DimStyle* dimstyle,
  double dimscale,
  ON_Line& line) const
{
  ON_Line line2d;
  if (!LandingLine2d(dimstyle, dimscale, line2d))
    return false;
  line.from = m_plane.PointAt(line2d.from.x, line2d.from.y);
  line.to = m_plane.PointAt(line2d.to.x, line2d.to.y);
  return true;
}